

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O2

void __thiscall
siamese::RecoveryMatrixState::PopulateColumns
          (RecoveryMatrixState *this,uint oldColumns,uint newColumns)

{
  uint uVar1;
  DecoderSubwindow *pDVar2;
  ColumnInfo *pCVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  if (oldColumns < newColumns) {
    pktalloc::LightVector<siamese::RecoveryMatrixState::ColumnInfo,_25U>::SetSize_Copy
              (&this->Columns,newColumns);
    uVar6 = this->PreviousNextCheckStart;
    uVar1 = this->CheckedRegion->NextCheckStart;
    this->PreviousNextCheckStart = uVar1;
    uVar4 = this->CheckedRegion->ElementStart;
    if (uVar4 < uVar6) {
      uVar4 = uVar6;
    }
    uVar6 = uVar4 & 0x3f;
    for (uVar5 = (ulong)(uVar4 >> 6); uVar5 < uVar1 + 0x3f >> 6; uVar5 = uVar5 + 1) {
      pDVar2 = (this->Window->Subwindows).DataPtr[uVar5];
      if (pDVar2->GotCount < 0x40) {
        do {
          uVar4 = pktalloc::CustomBitSet<64U>::FindFirstClear(&pDVar2->Got,uVar6);
          if (0x3f < uVar4) break;
          pCVar3 = (this->Columns).DataPtr;
          uVar6 = (uVar4 | (int)uVar5 << 6) + this->Window->ColumnStart & 0x3fffff;
          pCVar3[(int)oldColumns].Column = uVar6;
          pCVar3[(int)oldColumns].Original = (pDVar2->Originals)._M_elems + uVar4;
          pCVar3[(int)oldColumns].CX = (char)((ulong)(uVar6 * 199) % 0xfd) + '\x03';
          (pDVar2->Originals)._M_elems[uVar4].Column = oldColumns;
          oldColumns = oldColumns + 1;
          if (newColumns <= oldColumns) {
            return;
          }
          uVar6 = uVar4 + 1;
        } while (uVar4 != 0x3f);
      }
      uVar6 = 0;
    }
    this->Window->EmergencyDisabled = true;
  }
  return;
}

Assistant:

void RecoveryMatrixState::PopulateColumns(const unsigned oldColumns, const unsigned newColumns)
{
    if (oldColumns >= newColumns)
        return;

    Columns.SetSize_Copy(newColumns);

    // Resume adding from the last stop point
    unsigned elementStart     = PreviousNextCheckStart;
    PreviousNextCheckStart    = CheckedRegion->NextCheckStart;
    const unsigned elementEnd = CheckedRegion->NextCheckStart;
    if (elementStart < CheckedRegion->ElementStart)
        elementStart = CheckedRegion->ElementStart;

    // The column count increased which means we should have some columns to check
    SIAMESE_DEBUG_ASSERT(elementStart < elementEnd);

    // Check the current subwindow for next lost packet:
    const unsigned subwindowEnd = (elementEnd + kSubwindowSize - 1) / kSubwindowSize;
    unsigned subwindowIndex     = elementStart / kSubwindowSize;

    unsigned bitIndex = elementStart % kSubwindowSize;
    unsigned column   = oldColumns;

    while (subwindowIndex < subwindowEnd)
    {
        SIAMESE_DEBUG_ASSERT(subwindowIndex < Window->Subwindows.GetSize());

        DecoderSubwindow* subwindowPtr = Window->Subwindows.GetRef(subwindowIndex);

        // If there may be any lost packets in this subwindow:
        if (subwindowPtr->GotCount < kSubwindowSize)
        {
            do
            {
                // Seek next clear bit
                bitIndex = subwindowPtr->Got.FindFirstClear(bitIndex);

                // If there were none, skip this subwindow
                if (bitIndex >= kSubwindowSize)
                    break;

                // Calculate element index and stop if we hit the end of the valid data
                const unsigned element = subwindowIndex * kSubwindowSize + bitIndex;
                SIAMESE_DEBUG_ASSERT(element < elementEnd);

                ColumnInfo* columnPtr = Columns.GetPtr(column);
                columnPtr->Column     = Window->ElementToColumn(element);
                columnPtr->Original   = &subwindowPtr->Originals[bitIndex];
                columnPtr->CX         = GetColumnValue(columnPtr->Column);

                // Point lost original packet to recovery matrix column
                SIAMESE_DEBUG_ASSERT(columnPtr->Original->Buffer.Bytes == 0);
                columnPtr->Original->Column = column;

                // If we just added the last column:
                if (++column >= newColumns)
                    return;

            } while (++bitIndex < kSubwindowSize);
        }

        // Reset bit index to the front of the next subwindow
        bitIndex = 0;

        // Check next subwindow
        ++subwindowIndex;
    }

    SIAMESE_DEBUG_BREAK(); // Should never get here
    Window->EmergencyDisabled = true;
}